

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

bool __thiscall QMakeEvaluator::prepareProject(QMakeEvaluator *this,QString *inDir)

{
  bool bVar1;
  ulong uVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QFileInfo qdfi_2;
  QString stashfile;
  QString dir;
  QFileInfo qdfi_1;
  QFileInfo qsdfi;
  QString dir_1;
  QString sdir;
  QFileInfo qdfi;
  QString superfile;
  QString cachefile;
  QString conffile;
  QString superdir;
  VfsFlags flags;
  undefined4 in_stack_fffffffffffffcf8;
  VfsFlag in_stack_fffffffffffffcfc;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  QMakeVfs *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  QFlagsStorage<QMakeVfs::VfsFlag> in_stack_fffffffffffffd14;
  QFlagsStorage<QMakeVfs::VfsFlag> flags_00;
  Int local_2dc;
  byte local_2c1;
  undefined8 local_2a8;
  undefined1 local_2a0 [28];
  undefined4 local_284;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  QFileInfo local_1f8 [80];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_194;
  undefined4 local_14c;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_c0;
  undefined1 local_b8 [28];
  undefined4 local_9c;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  QString local_28;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  QFlags<QMakeVfs::VfsFlag>::QFlags
            ((QFlags<QMakeVfs::VfsFlag> *)
             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),in_stack_fffffffffffffcfc
            );
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_28.d.size = -0x5555555555555556;
  QString::QString((QString *)0x2f8306);
  flags_00.i = in_stack_fffffffffffffd14.i;
  if ((**(byte **)(in_RDI + 0x290) & 1) != 0) {
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x2f8355);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    bVar1 = QString::isEmpty((QString *)0x2f83ac);
    if (bVar1) {
      bVar1 = QString::isEmpty((QString *)0x2f83c3);
      if (bVar1) {
        local_2dc = 2;
      }
      else {
        QString::operator=(&local_28,(QString *)(in_RDI + 0x70));
        do {
          local_70 = 0xaaaaaaaaaaaaaaaa;
          local_68 = 0xaaaaaaaaaaaaaaaa;
          local_60 = 0xaaaaaaaaaaaaaaaa;
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT44(in_stack_fffffffffffffd14.i,in_stack_fffffffffffffd10),
                     (char *)in_stack_fffffffffffffd08);
          ::operator+((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                     );
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QLatin1String> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          local_9c = local_c;
          bVar1 = QMakeVfs::exists(in_stack_fffffffffffffd08,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                   (VfsFlags)in_stack_fffffffffffffd14.i);
          if (bVar1) {
            QDir::cleanPath((QString *)local_b8);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            QString::~QString((QString *)0x2f84ce);
            local_2dc = 3;
          }
          else {
            local_c0 = 0xaaaaaaaaaaaaaaaa;
            QFileInfo::QFileInfo((QFileInfo *)&local_c0,(QString *)&local_28);
            uVar2 = QFileInfo::isRoot();
            if ((uVar2 & 1) == 0) {
              QFileInfo::path();
              QString::operator=((QString *)
                                 CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              QString::~QString((QString *)0x2f8560);
              local_2dc = 0;
            }
            else {
              QString::clear((QString *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
              local_2dc = 3;
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_c0);
          }
          QString::~QString((QString *)0x2f8582);
        } while (local_2dc == 0);
        local_f0 = 0xaaaaaaaaaaaaaaaa;
        local_e8 = 0xaaaaaaaaaaaaaaaa;
        local_e0 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_108 = 0xaaaaaaaaaaaaaaaa;
        local_100 = 0xaaaaaaaaaaaaaaaa;
        local_f8 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        do {
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT44(in_stack_fffffffffffffd14.i,in_stack_fffffffffffffd10),
                     (char *)in_stack_fffffffffffffd08);
          ::operator+((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                     );
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QLatin1String> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          QString::operator=((QString *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          QString::~QString((QString *)0x2f867d);
          local_14c = local_c;
          bVar1 = QMakeVfs::exists(in_stack_fffffffffffffd08,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                   (VfsFlags)in_stack_fffffffffffffd14.i);
          if (!bVar1) {
            QString::clear((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00))
            ;
          }
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT44(in_stack_fffffffffffffd14.i,in_stack_fffffffffffffd10),
                     (char *)in_stack_fffffffffffffd08);
          ::operator+((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                      (QLatin1String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                     );
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QLatin1String> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          QString::operator=((QString *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          QString::~QString((QString *)0x2f8724);
          local_194 = local_c;
          bVar1 = QMakeVfs::exists(in_stack_fffffffffffffd08,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                   (VfsFlags)in_stack_fffffffffffffd14.i);
          if (!bVar1) {
            QString::clear((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00))
            ;
          }
          bVar1 = QString::isEmpty((QString *)0x2f8770);
          if ((!bVar1) || (bVar1 = QString::isEmpty((QString *)0x2f8783), !bVar1)) {
            bVar1 = ::operator!=((QString *)
                                 CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            if (bVar1) {
              QString::operator=((QString *)(in_RDI + 0x128),(QString *)&local_f0);
            }
            QString::operator=((QString *)(in_RDI + 0x140),(QString *)&local_108);
            local_2dc = 0;
            break;
          }
          bVar1 = ::operator==((QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          if (bVar1) {
            local_2dc = 2;
            break;
          }
          local_1a0 = 0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_1a0,(QString *)&local_f0);
          local_1a8 = 0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_1a8,(QString *)&local_108);
          uVar2 = QFileInfo::isRoot();
          if (((uVar2 & 1) == 0) && (uVar2 = QFileInfo::isRoot(), (uVar2 & 1) == 0)) {
            QFileInfo::path();
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            QString::~QString((QString *)0x2f88ae);
            QFileInfo::path();
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            QString::~QString((QString *)0x2f88e5);
            local_2dc = 0;
          }
          else {
            local_2dc = 2;
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_1a8);
          QFileInfo::~QFileInfo((QFileInfo *)&local_1a0);
        } while (local_2dc == 0);
        QString::~QString((QString *)0x2f892b);
        QString::~QString((QString *)0x2f8938);
        if (local_2dc == 0) goto LAB_002f89a5;
      }
    }
    else {
      QFileInfo::QFileInfo(local_1f8,(QString *)&local_58);
      QFileInfo::path();
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x2f8998);
      QFileInfo::~QFileInfo(local_1f8);
LAB_002f89a5:
      QDir::cleanPath((QString *)local_210);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x2f89e0);
      QDir::cleanPath((QString *)local_228);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x2f8a1b);
      local_2dc = 0;
    }
    QString::~QString((QString *)0x2f8a30);
    QString::~QString((QString *)0x2f8a3d);
    flags_00.i = local_2dc;
    if ((local_2dc != 0) && (local_2dc != 2)) goto LAB_002f8c76;
  }
  local_240 = 0xaaaaaaaaaaaaaaaa;
  local_238 = 0xaaaaaaaaaaaaaaaa;
  local_230 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  do {
    local_258 = 0xaaaaaaaaaaaaaaaa;
    local_250 = 0xaaaaaaaaaaaaaaaa;
    local_248 = 0xaaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(flags_00.i,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    ::operator+((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    bVar1 = QString::isEmpty((QString *)0x2f8b20);
    if (bVar1) {
      in_stack_fffffffffffffd08 = (QMakeVfs *)(in_RDI + 0x140);
    }
    else {
      in_stack_fffffffffffffd08 = (QMakeVfs *)&local_28;
    }
    bVar1 = ::operator==((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    if (bVar1) {
LAB_002f8b8d:
      QDir::cleanPath((QString *)local_2a0);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x2f8bbf);
      local_2dc = 7;
    }
    else {
      local_284 = local_c;
      bVar1 = QMakeVfs::exists(in_stack_fffffffffffffd08,
                               (QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               (VfsFlags)flags_00.i);
      if (bVar1) goto LAB_002f8b8d;
      local_2a8 = 0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_2a8,(QString *)&local_240);
      uVar2 = QFileInfo::isRoot();
      if ((uVar2 & 1) == 0) {
        QFileInfo::path();
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                           (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
        ;
        QString::~QString((QString *)0x2f8c2c);
        local_2dc = 0;
      }
      else {
        local_2dc = 7;
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_2a8);
    }
    QString::~QString((QString *)0x2f8c4b);
  } while (local_2dc == 0);
  local_2c1 = 1;
  QString::~QString((QString *)0x2f8c76);
LAB_002f8c76:
  QString::~QString((QString *)0x2f8c83);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_2c1 & 1);
}

Assistant:

bool QMakeEvaluator::prepareProject(const QString &inDir)
{
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    QString superdir;
    if (m_option->do_cache) {
        QString conffile;
        QString cachefile = m_option->cachefile;
        if (cachefile.isEmpty())  { //find it as it has not been specified
            if (m_outputDir.isEmpty())
                goto no_cache;
            superdir = m_outputDir;
            forever {
                QString superfile = superdir + QLatin1String("/.qmake.super");
                if (m_vfs->exists(superfile, flags)) {
                    m_superfile = QDir::cleanPath(superfile);
                    break;
                }
                QFileInfo qdfi(superdir);
                if (qdfi.isRoot()) {
                    superdir.clear();
                    break;
                }
                superdir = qdfi.path();
            }
            QString sdir = inDir;
            QString dir = m_outputDir;
            forever {
                conffile = sdir + QLatin1String("/.qmake.conf");
                if (!m_vfs->exists(conffile, flags))
                    conffile.clear();
                cachefile = dir + QLatin1String("/.qmake.cache");
                if (!m_vfs->exists(cachefile, flags))
                    cachefile.clear();
                if (!conffile.isEmpty() || !cachefile.isEmpty()) {
                    if (dir != sdir)
                        m_sourceRoot = sdir;
                    m_buildRoot = dir;
                    break;
                }
                if (dir == superdir)
                    goto no_cache;
                QFileInfo qsdfi(sdir);
                QFileInfo qdfi(dir);
                if (qsdfi.isRoot() || qdfi.isRoot())
                    goto no_cache;
                sdir = qsdfi.path();
                dir = qdfi.path();
            }
        }